

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O0

void __thiscall trng::lcg64_count_shift::jump2(lcg64_count_shift *this,uint s)

{
  long lVar1;
  long extraout_RAX;
  result_type rVar2;
  uint in_ESI;
  result_type in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  uint i;
  result_type powers_of_2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  result_type in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  pow(in_XMM0_Qa,in_XMM1_Qa);
  rVar2 = f(in_stack_ffffffffffffffe8,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  *(result_type *)(in_RDI + 0x18) = lVar1 * extraout_RAX + rVar2 * *(long *)(in_RDI + 8);
  for (uVar3 = 1; uVar3 <= in_ESI; uVar3 = uVar3 + 1) {
    mult_modulo(CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_RDI);
  }
  rVar2 = mult_modulo(CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_RDI);
  *(result_type *)(in_RDI + 0x20) = rVar2 + *(long *)(in_RDI + 0x20);
  if (0x1ffffffffffffffe < *(ulong *)(in_RDI + 0x20)) {
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -0x1fffffffffffffff;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_count_shift::jump2(unsigned int s) {
    // LCG part
    S.r = S.r * pow(P.a, 1ull << s) + f(1ull << s, P.a) * P.b;
    // counting part
    result_type powers_of_2{1};
    for (unsigned int i{1}; i <= s; ++i)
      powers_of_2 = mult_modulo(2, powers_of_2);
    S.count += mult_modulo(powers_of_2, P.inc);
    if (S.count >= modulus)
      S.count -= modulus;
  }